

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  char *pcVar2;
  bool bVar3;
  LogMessage *pLVar4;
  string_view str;
  string_view v;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view v_00;
  string_view str_05;
  string_view str_06;
  atomic<unsigned_int> local_4c;
  LogMessage local_48;
  __atomic_base<unsigned_int> local_34;
  
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[3])
              (pEVar1,(ulong)(uint)line,(ulong)(uint)col,message._M_len,message._M_str);
    return;
  }
  if (line < 0) {
    bVar3 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                      (&ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)::
                        absl_log_internal_stateful_condition_state);
    local_4c.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         (__atomic_base<unsigned_int>)
         ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)::
         absl_log_internal_stateful_condition_state;
    if (!bVar3) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x18e);
    str_04._M_str = "Warning parsing text-format ";
    str_04._M_len = 0x1c;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_48,str_04);
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v_00._M_str = pcVar2 + ~v_00._M_len;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_48,v_00);
    str_05._M_str = " (N = ";
    str_05._M_len = 6;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_05);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_int,_0>
                       (pLVar4,(uint *)&local_4c);
    str_06._M_str = "): ";
    str_06._M_len = 3;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_06);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,message);
  }
  else {
    bVar3 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                      (&ReportWarning::absl_log_internal_stateful_condition_state);
    if (!bVar3) {
      return;
    }
    local_34._M_i =
         (__int_type_conflict1)
         ReportWarning::absl_log_internal_stateful_condition_state.counter_.
         super___atomic_base<unsigned_int>._M_i;
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x189);
    str._M_str = "Warning parsing text-format ";
    str._M_len = 0x1c;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_48,str);
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_48,v);
    str_00._M_str = ": ";
    str_00._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_00);
    local_4c.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)(line + 1);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                       (pLVar4,(int *)&local_4c);
    str_01._M_str = ":";
    str_01._M_len = 1;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_01);
    local_4c.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)(col + 1);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                       (pLVar4,(int *)&local_4c);
    str_02._M_str = " (N = ";
    str_02._M_len = 6;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_02);
    local_4c.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)local_34._M_i;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_int,_0>
                       (pLVar4,(uint *)&local_4c);
    str_03._M_str = "): ";
    str_03._M_len = 3;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar4,str_03);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,message);
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }